

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O0

_Bool COSE_Sign0_Free(HCOSE_SIGN0 h)

{
  _Bool _Var1;
  COSE_Sign0Message *pMessage;
  HCOSE_SIGN0 h_local;
  
  _Var1 = IsValidSign0Handle(h);
  if (_Var1) {
    if (*(int *)(h + 0x10) < 2) {
      _COSE_RemoveFromList(&Sign0Root,(COSE *)h);
      _COSE_Sign0_Release((COSE_Sign0Message *)h);
      free(h);
      h_local._7_1_ = true;
    }
    else {
      *(int *)(h + 0x10) = *(int *)(h + 0x10) + -1;
      h_local._7_1_ = true;
    }
  }
  else {
    h_local._7_1_ = false;
  }
  return h_local._7_1_;
}

Assistant:

bool COSE_Sign0_Free(HCOSE_SIGN0 h)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context *context;
#endif
	COSE_Sign0Message * pMessage = (COSE_Sign0Message *)h;

	if (!IsValidSign0Handle(h)) return false;

	//  Check reference counting
	if (pMessage->m_message.m_refCount > 1) {
		pMessage->m_message.m_refCount--;
		return true;
	}

	_COSE_RemoveFromList(&Sign0Root, &pMessage->m_message);

#ifdef USE_CBOR_CONTEXT
	context = &pMessage->m_message.m_allocContext;
#endif

	_COSE_Sign0_Release(pMessage);

	COSE_FREE(pMessage, context);

	return true;
}